

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rbuFossilDeltaFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  byte *pbVar8;
  char *z;
  uint n;
  byte *pbVar9;
  char *__dest;
  Mem *pMem;
  uint uVar10;
  uchar *zStart;
  uint local_60;
  
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  pvVar7 = sqlite3_value_blob(*argv);
  iVar4 = sqlite3ValueBytes(argv[1],'\x01');
  pbVar8 = (byte *)sqlite3_value_blob(argv[1]);
  bVar2 = *pbVar8;
  bVar1 = rbuDeltaGetInt_zValue[bVar2 & 0x7f];
  if ((char)bVar1 < '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    pbVar9 = pbVar8;
    do {
      pbVar9 = pbVar9 + 1;
      uVar5 = uVar5 * 0x40 + (uint)bVar1;
      bVar2 = *pbVar9;
      bVar1 = rbuDeltaGetInt_zValue[bVar2 & 0x7f];
    } while (-1 < (char)bVar1);
  }
  n = 0xffffffff;
  if (bVar2 == 10) {
    n = uVar5;
  }
  if ((int)n < 0) {
    context->isError = 1;
    pMem = context->pOut;
  }
  else {
    z = (char *)sqlite3_malloc(n + 1);
    if (z == (char *)0x0) {
      sqlite3_result_error_nomem(context);
      return;
    }
    bVar2 = *pbVar8;
    uVar5 = 0;
    bVar1 = rbuDeltaGetInt_zValue[bVar2 & 0x7f];
    pbVar9 = pbVar8;
    while (-1 < (char)bVar1) {
      uVar5 = uVar5 * 0x40 + (uint)bVar1;
      bVar2 = pbVar9[1];
      pbVar9 = pbVar9 + 1;
      bVar1 = rbuDeltaGetInt_zValue[bVar2 & 0x7f];
    }
    if (((bVar2 == 10) && (iVar4 = ((int)pbVar8 - (int)pbVar9) + iVar4 + -1, 0 < iVar4)) &&
       (bVar2 = pbVar9[1], bVar2 != 0)) {
      pbVar9 = pbVar9 + 1;
      local_60 = 0;
      __dest = z;
      do {
        bVar1 = rbuDeltaGetInt_zValue[bVar2 & 0x7f];
        uVar10 = 0;
        pbVar8 = pbVar9;
        if (-1 < (char)bVar1) {
          uVar10 = 0;
          do {
            uVar10 = uVar10 * 0x40 + (uint)bVar1;
            bVar2 = pbVar8[1];
            pbVar8 = pbVar8 + 1;
            bVar1 = rbuDeltaGetInt_zValue[bVar2 & 0x7f];
          } while (-1 < (char)bVar1);
        }
        iVar4 = iVar4 + ((int)pbVar9 - (int)pbVar8);
        if (bVar2 == 0x3a) {
          if ((uVar5 < local_60 + uVar10) || (iVar4 <= (int)uVar10)) break;
          memcpy(__dest,pbVar8 + 1,(ulong)uVar10);
          pbVar9 = pbVar8 + uVar10;
          iVar4 = iVar4 + ~uVar10;
        }
        else {
          if (bVar2 != 0x40) {
            uVar10 = 0xffffffff;
            if ((bVar2 == 0x3b) && (*__dest = '\0', local_60 == uVar5)) {
              uVar10 = local_60;
            }
            goto LAB_001d2ede;
          }
          bVar1 = pbVar8[1];
          uVar6 = 0;
          bVar2 = rbuDeltaGetInt_zValue[bVar1 & 0x7f];
          pbVar9 = pbVar8 + 1;
          while (-1 < (char)bVar2) {
            uVar6 = uVar6 * 0x40 + (uint)bVar2;
            bVar1 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
            bVar2 = rbuDeltaGetInt_zValue[bVar1 & 0x7f];
          }
          iVar4 = ((int)(pbVar8 + 1) - (int)pbVar9) + iVar4 + -1;
          if ((((bVar1 != 0x2c) && (0 < iVar4)) || (uVar5 < local_60 + uVar10)) ||
             (iVar3 < (int)(uVar6 + uVar10))) break;
          iVar4 = iVar4 + -1;
          memcpy(__dest,(void *)((ulong)uVar6 + (long)pvVar7),(ulong)uVar10);
        }
        local_60 = local_60 + uVar10;
        pbVar9 = pbVar9 + 1;
        bVar2 = *pbVar9;
        if ((bVar2 == 0) || (__dest = __dest + uVar10, iVar4 < 1)) break;
      } while( true );
    }
    uVar10 = 0xffffffff;
LAB_001d2ede:
    if (uVar10 == n) {
      setResultStrOrError(context,z,n,'\0',sqlite3_free);
      return;
    }
    sqlite3_free(z);
    context->isError = 1;
    pMem = context->pOut;
  }
  sqlite3VdbeMemSetStr
            (pMem,"corrupt fossil delta",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

static void rbuFossilDeltaFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *aDelta;
  int nDelta;
  const char *aOrig;
  int nOrig;

  int nOut;
  int nOut2;
  char *aOut;

  assert( argc==2 );

  nOrig = sqlite3_value_bytes(argv[0]);
  aOrig = (const char*)sqlite3_value_blob(argv[0]);
  nDelta = sqlite3_value_bytes(argv[1]);
  aDelta = (const char*)sqlite3_value_blob(argv[1]);

  /* Figure out the size of the output */
  nOut = rbuDeltaOutputSize(aDelta, nDelta);
  if( nOut<0 ){
    sqlite3_result_error(context, "corrupt fossil delta", -1);
    return;
  }

  aOut = sqlite3_malloc(nOut+1);
  if( aOut==0 ){
    sqlite3_result_error_nomem(context);
  }else{
    nOut2 = rbuDeltaApply(aOrig, nOrig, aDelta, nDelta, aOut);
    if( nOut2!=nOut ){
      sqlite3_free(aOut);
      sqlite3_result_error(context, "corrupt fossil delta", -1);
    }else{
      sqlite3_result_blob(context, aOut, nOut, sqlite3_free);
    }
  }
}